

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
parse_offset_table(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                  string *string_offsets_raw)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  reference pvVar4;
  undefined4 local_38;
  uint i;
  uint string_offset_count;
  uint32_t *string_offsets_u32;
  string *string_offsets_raw_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *string_data_offsets;
  
  lVar2 = std::__cxx11::string::data();
  uVar3 = std::__cxx11::string::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,uVar3 >> 2 & 0xffffffff);
  for (local_38 = 0; local_38 < (uint)(uVar3 >> 2); local_38 = local_38 + 1) {
    uVar1 = mg::be_to_host_u32(*(uint32_t *)(lVar2 + (ulong)local_38 * 4));
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)local_38);
    *pvVar4 = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t>
parse_offset_table(const std::string &string_offsets_raw) {
  // Extract the string offset table
  const uint32_t *string_offsets_u32 =
      reinterpret_cast<const uint32_t *>(string_offsets_raw.data());
  const unsigned string_offset_count =
      string_offsets_raw.size() / sizeof(uint32_t);
  std::vector<uint32_t> string_data_offsets;
  string_data_offsets.resize(string_offset_count);
  for (unsigned i = 0; i < string_offset_count; i++) {
    string_data_offsets[i] = mg::be_to_host_u32(string_offsets_u32[i]);
  }
  return string_data_offsets;
}